

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool __thiscall
ThreadedReplayer::enqueue_create_pipeline_layout
          (ThreadedReplayer *this,Hash index,VkPipelineLayoutCreateInfo *create_info,
          VkPipelineLayout *layout)

{
  mapped_type pVVar1;
  PFN_vkCreatePipelineLayout p_Var2;
  bool bVar3;
  VkResult VVar4;
  PerThreadData *pPVar5;
  pointer pVVar6;
  FeatureFilter *this_00;
  VkDevice pVVar7;
  mapped_type *ppVVar8;
  VkPipelineLayout *layout_local;
  VkPipelineLayoutCreateInfo *create_info_local;
  Hash index_local;
  ThreadedReplayer *this_local;
  
  create_info_local = (VkPipelineLayoutCreateInfo *)index;
  index_local = (Hash)this;
  pPVar5 = get_per_thread_data(this);
  if (pPVar5->expected_tag == RESOURCE_PIPELINE_LAYOUT) {
    pVVar6 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ::operator->(&this->device);
    this_00 = Fossilize::VulkanDevice::get_feature_filter(pVVar6);
    bVar3 = Fossilize::FeatureFilter::pipeline_layout_is_supported(this_00,create_info);
    p_Var2 = vkCreatePipelineLayout;
    if (bVar3) {
      pVVar6 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      pVVar7 = Fossilize::VulkanDevice::get_device(pVVar6);
      VVar4 = (*p_Var2)(pVVar7,create_info,(VkAllocationCallbacks *)0x0,layout);
      if (VVar4 == VK_SUCCESS) {
        pVVar1 = *layout;
        ppVVar8 = std::
                  unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
                  ::operator[](&this->pipeline_layouts,(key_type *)&create_info_local);
        *ppVVar8 = pVVar1;
        this_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"Fossilize ERROR: Creating pipeline layout %0lX Failed!\n",create_info_local
               );
        fflush(_stderr);
        this_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Fossilize WARN: Pipeline layout %016lx is not supported. Skipping.\n",
              create_info_local);
      fflush(_stderr);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_pipeline_layout(Hash index, const VkPipelineLayoutCreateInfo *create_info, VkPipelineLayout *layout) override
	{
		if (get_per_thread_data().expected_tag != RESOURCE_PIPELINE_LAYOUT)
			return false;

		if (!device->get_feature_filter().pipeline_layout_is_supported(create_info))
		{
			LOGW("Pipeline layout %016" PRIx64 " is not supported. Skipping.\n", index);
			return false;
		}

		// Playback in-order.
		if (vkCreatePipelineLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
		{
			LOGE("Creating pipeline layout %0" PRIX64 " Failed!\n", index);
			return false;
		}
		pipeline_layouts[index] = *layout;
		return true;
	}